

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_line_bezier(rf_vec2 start_pos,rf_vec2 end_pos,float thick,rf_color color)

{
  rf_vec2 end_pos_00;
  float fVar1;
  float fVar2;
  undefined8 local_38;
  rf_int i;
  rf_vec2 current;
  rf_vec2 previous;
  float thick_local;
  rf_color color_local;
  rf_vec2 end_pos_local;
  rf_vec2 start_pos_local;
  
  current = start_pos;
  for (local_38 = 1; local_38 < 0x19; local_38 = local_38 + 1) {
    end_pos_local.y = start_pos.y;
    color_local = (rf_color)end_pos.y;
    fVar1 = rf_shapes_ease_cubic_in_out
                      ((float)local_38,end_pos_local.y,(float)color_local - end_pos_local.y,24.0);
    thick_local = end_pos.x;
    end_pos_local.x = start_pos.x;
    fVar2 = current.x + (thick_local - end_pos_local.x) / 24.0;
    end_pos_00.y = fVar1;
    end_pos_00.x = fVar2;
    rf_draw_line_ex(current,end_pos_00,thick,color);
    current.y = fVar1;
    current.x = fVar2;
  }
  return;
}

Assistant:

RF_API void rf_draw_line_bezier(rf_vec2 start_pos, rf_vec2 end_pos, float thick, rf_color color)
{
#define RF_LINE_DIVISIONS 24 // Bezier line divisions

    rf_vec2 previous = start_pos;
    rf_vec2 current;

    for (rf_int i = 1; i <= RF_LINE_DIVISIONS; i++)
    {
        // Cubic easing in-out
        // NOTE: Easing is calculated only for y position value
        current.y = rf_shapes_ease_cubic_in_out((float)i, start_pos.y, end_pos.y - start_pos.y, (float)RF_LINE_DIVISIONS);
        current.x = previous.x + (end_pos.x - start_pos.x)/ (float)RF_LINE_DIVISIONS;

        rf_draw_line_ex(previous, current, thick, color);

        previous = current;
    }

#undef RF_LINE_DIVISIONS
}